

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O0

Node * __thiscall Jzon::Node::operator=(Node *this,Node *rhs)

{
  Data *this_00;
  bool bVar1;
  Node *rhs_local;
  Node *this_local;
  
  if (this != rhs) {
    if (((this->data != (Data *)0x0) && (bVar1 = Data::release(this->data), bVar1)) &&
       (this_00 = this->data, this_00 != (Data *)0x0)) {
      Data::~Data(this_00);
      operator_delete(this_00);
    }
    this->data = rhs->data;
    if (this->data != (Data *)0x0) {
      Data::addRef(this->data);
    }
  }
  return this;
}

Assistant:

Node &Node::operator=(const Node &rhs)
	{
		if (this != &rhs)
		{
			if (data != NULL && data->release())
			{
				delete data;
			}
			data = rhs.data;
			if (data != NULL)
			{
				data->addRef();
			}
		}
		return *this;
	}